

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

void __thiscall Triangle::Triangle(Triangle *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,ColorRGB c)

{
  undefined1 auVar1 [16];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_68;
  undefined8 local_58;
  value_type local_50;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = c._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)((long)&(this->e0).field_0 + 4) = 0;
  *(undefined8 *)&(this->v1).field_0 = 0;
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->n).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->e1).field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->e2).field_0 + 4) = 0;
  *(undefined8 *)&(this->n).field_0 = 0;
  (this->v1).field_0.field_0.z = 0.0;
  *(undefined8 *)&(this->v2).field_0 = 0;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0;
  local_68._0_8_ = *(undefined8 *)&v0->field_0;
  local_68.field_0.z = (v0->field_0).field_0.z;
  local_68.field_0.w = 1.0;
  glm::detail::operator*(ltw,(row_type *)&local_68.field_0);
  *(undefined8 *)&(this->v0).field_0 = local_58;
  (this->v0).field_0.field_0.z = local_50;
  local_68._0_8_ = *(undefined8 *)&v1->field_0;
  local_68.field_0.z = (v1->field_0).field_0.z;
  local_68.field_0.w = 1.0;
  glm::detail::operator*(ltw,(row_type *)&local_68.field_0);
  *(undefined8 *)&(this->v1).field_0 = local_58;
  (this->v1).field_0.field_0.z = local_50;
  local_68._0_8_ = *(undefined8 *)&v2->field_0;
  local_68.field_0.z = (v2->field_0).field_0.z;
  local_68.field_0.w = 1.0;
  glm::detail::operator*(ltw,(row_type *)&local_68.field_0);
  auVar1 = local_48;
  *(undefined8 *)&(this->v2).field_0 = local_58;
  (this->v2).field_0.field_0.z = local_50;
  (this->color).r = (float)local_48._0_4_;
  (this->color).g = (float)local_48._4_4_;
  (this->color).b = c.b;
  local_48 = auVar1;
  _calculateNormal(this);
  _calculateEdges(this);
  return;
}

Assistant:

Triangle::Triangle(
    const glm::mat4 &ltw,
    glm::vec3 v0,
    glm::vec3 v1,
    glm::vec3 v2,
    ColorRGB c) {
    
    this->v0 = glm::vec3(ltw * glm::vec4(v0, 1));
    this->v1 = glm::vec3(ltw * glm::vec4(v1, 1));
    this->v2 = glm::vec3(ltw * glm::vec4(v2, 1));
    
    color = c;
    
//     std::cout << "v0: (" << this->v0.x << ", " << this->v0.y << ", " << this->v0.z << ") ";
//     std::cout << "v1: (" << this->v1.x << ", " << this->v1.y << ", " << this->v1.z << ") ";
//     std::cout << "v2: (" << this->v2.x << ", " << this->v2.y << ", " << this->v2.z << ") ";
  
    _calculateNormal();
    _calculateEdges();
}